

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void tinygltf::WriteBinaryGltfStream(ostream *stream,string *content)

{
  ulong uVar1;
  uint uVar2;
  int model_format;
  int length;
  int version;
  int model_length;
  string padding;
  string header;
  undefined4 local_80;
  int local_7c [3];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"glTF","");
  local_7c[1] = 2;
  uVar1 = content->_M_string_length;
  uVar2 = (uint)uVar1 & 3;
  local_7c[0] = (uint)uVar1 + uVar2 + 0x14;
  std::ostream::write((char *)stream,(long)local_50[0]);
  std::ostream::write((char *)stream,(long)(local_7c + 1));
  std::ostream::write((char *)stream,(long)local_7c);
  local_7c[2] = (int)content->_M_string_length + uVar2;
  local_80 = 0x4e4f534a;
  std::ostream::write((char *)stream,(long)(local_7c + 2));
  std::ostream::write((char *)stream,(long)&local_80);
  std::ostream::write((char *)stream,(long)(content->_M_dataplus)._M_p);
  if ((uVar1 & 3) != 0) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(byte)uVar1 & 3);
    std::ostream::write((char *)stream,(long)local_70[0]);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

static void WriteBinaryGltfStream(std::ostream &stream,
                                  const std::string &content) {
  const std::string header = "glTF";
  const int version = 2;
  const int padding_size = content.size() % 4;

  // 12 bytes for header, JSON content length, 8 bytes for JSON chunk info,
  // padding
  const int length = 12 + 8 + int(content.size()) + padding_size;

  stream.write(header.c_str(), std::streamsize(header.size()));
  stream.write(reinterpret_cast<const char *>(&version), sizeof(version));
  stream.write(reinterpret_cast<const char *>(&length), sizeof(length));

  // JSON chunk info, then JSON data
  const int model_length = int(content.size()) + padding_size;
  const int model_format = 0x4E4F534A;
  stream.write(reinterpret_cast<const char *>(&model_length),
               sizeof(model_length));
  stream.write(reinterpret_cast<const char *>(&model_format),
               sizeof(model_format));
  stream.write(content.c_str(), std::streamsize(content.size()));

  // Chunk must be multiplies of 4, so pad with spaces
  if (padding_size > 0) {
    const std::string padding = std::string(size_t(padding_size), ' ');
    stream.write(padding.c_str(), std::streamsize(padding.size()));
  }
}